

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O1

Vec_Int_t * Gia_ManCreateMap(Gia_Man_t *p,Vec_Int_t *vFadds)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *__s;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = p->nObjs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar4 << 2);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar1;
  memset(__s,0xff,(long)iVar1 << 2);
  uVar2 = vFadds->nSize;
  if (4 < (long)(int)uVar2) {
    uVar5 = 4;
    uVar6 = 0;
    do {
      if ((ulong)(long)(int)uVar2 <= uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = vFadds->pArray[uVar5];
      if (((long)iVar4 < 0) || (iVar1 <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar4] = (int)uVar6;
      uVar6 = uVar6 + 1;
      uVar5 = uVar5 + 5;
    } while ((ulong)uVar2 / 5 != uVar6);
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_ManCreateMap( Gia_Man_t * p, Vec_Int_t * vFadds )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );  int i;
    Dtc_ForEachFadd( vFadds, i )
        Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+4), i );
    return vMap;
}